

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSMF.cpp
# Opt level: O2

DWORD __thiscall dsa::CSMF::ReadNextVnum(CSMF *this,int trk)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  
  bVar1 = ReadNextByte(this,trk);
  uVar2 = (uint)bVar1;
  uVar3 = bVar1 & 0x7f;
  while (0x7f < uVar2) {
    bVar1 = ReadNextByte(this,trk);
    uVar2 = (uint)bVar1;
    uVar3 = uVar3 << 7 | uVar2 & 0x7f;
  }
  return (long)(int)uVar3;
}

Assistant:

DWORD CSMF::ReadNextVnum(int trk) {
  int ret, d;

  ret = d = ReadNextByte(trk);
  ret&=0x7F;
  while(d&0x80) {
    d = ReadNextByte(trk);
    ret = (ret<<7)|(d&0x7f);
  }
  return ret;
}